

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

RegExp * re2c::repeat_from(RegExp *e,uint32_t n)

{
  RegExp *pRVar1;
  CloseOp *this;
  
  pRVar1 = repeat(e,n);
  this = (CloseOp *)operator_new(0x10);
  CloseOp::CloseOp(this,e);
  pRVar1 = doCat(pRVar1,(RegExp *)this);
  return pRVar1;
}

Assistant:

RegExp * repeat_from (RegExp * e, uint32_t n)
{
	RegExp * r1 = repeat (e, n);
	RegExp * r2 = new CloseOp (e);
	return doCat (r1, r2);
}